

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

int accum_state_var(vector_t ***var,vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,
                   uint32 *veclen,uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  vector_t pfVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  
  for (uVar7 = 0; uVar7 != n_frame; uVar7 = uVar7 + 1) {
    uVar3 = 0;
    uVar5 = 0;
    if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
      uVar3 = (ulong)sseq[uVar7];
      uVar5 = ci_sseq[uVar7];
    }
    for (uVar6 = 0; uVar6 != n_feat; uVar6 = uVar6 + 1) {
      *dnom[uVar3][uVar6] = (float32)((float)*dnom[uVar3][uVar6] + 1.0);
      if ((uint)uVar3 != uVar5) {
        *dnom[uVar5][uVar6] = (float32)((float)*dnom[uVar5][uVar6] + 1.0);
      }
      uVar1 = veclen[uVar6];
      for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
        pfVar2 = feat[uVar7][uVar6];
        fVar8 = pfVar2[uVar4] - (*mean[uVar3][uVar6])[uVar4];
        (*var[uVar3][uVar6])[uVar4] = fVar8 * fVar8 + (*var[uVar3][uVar6])[uVar4];
        if ((uint)uVar3 != uVar5) {
          fVar8 = pfVar2[uVar4] - (*mean[uVar5][uVar6])[uVar4];
          (*var[uVar5][uVar6])[uVar4] = fVar8 * fVar8 + (*var[uVar5][uVar6])[uVar4];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
accum_state_var(vector_t ***var,
		vector_t ***mean,
		float32  ***dnom,
		vector_t **feat,
		uint32 n_feat,
		const uint32 *veclen,
		uint32 *sseq,
		uint32 *ci_sseq,
		uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */
    float32 diff;

    for (t = 0; t < n_frame; t++) {

	if (sseq && ci_sseq) {
	    /* get the tied state for time t */
	    s = sseq[t];
	
	    /* get the CI state as well */
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */

		diff = feat[t][f][c] - mean[s][f][0][c];
		var[s][f][0][c] += diff * diff;

		if (s != ci_s) {
		    diff = feat[t][f][c] - mean[ci_s][f][0][c];
		    var[ci_s][f][0][c] += diff * diff;
		}
	    }
	}
    }
    return 0;
}